

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O3

long gimage::cmp<float>(Image<float,_gimage::PixelTraits<float>_> *diff,
                       Image<float,_gimage::PixelTraits<float>_> *im1,
                       Image<float,_gimage::PixelTraits<float>_> *im2,
                       vector<float,_std::allocator<float>_> *tol)

{
  int iVar1;
  pointer pfVar2;
  pointer pfVar3;
  long lVar4;
  long lVar5;
  float ***pppfVar6;
  float ***pppfVar7;
  float ***pppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  
  lVar12 = -1;
  if (((im1->width == im2->width) && (im1->height == im2->height)) && (im1->depth == im2->depth)) {
    Image<float,_gimage::PixelTraits<float>_>::setSize(diff,im1->width,im1->height,(long)im1->depth)
    ;
    iVar1 = im1->depth;
    if ((long)iVar1 < 1) {
      lVar12 = 0;
    }
    else {
      pfVar2 = (tol->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3 = (tol->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar4 = im1->width;
      lVar5 = im1->height;
      fVar17 = 0.0;
      lVar15 = 0;
      lVar12 = 0;
      do {
        if (lVar15 < (int)((ulong)((long)pfVar3 - (long)pfVar2) >> 2)) {
          fVar17 = pfVar2[lVar15];
        }
        if (0 < lVar5) {
          pppfVar6 = im1->img;
          pppfVar7 = im2->img;
          pppfVar8 = diff->img;
          lVar16 = 0;
          do {
            if (0 < lVar4) {
              pfVar9 = pppfVar6[lVar15][lVar16];
              pfVar10 = pppfVar7[lVar15][lVar16];
              pfVar11 = pppfVar8[lVar15][lVar16];
              lVar13 = 0;
              do {
                fVar14 = ABS(pfVar10[lVar13]);
                if ((uint)ABS(pfVar9[lVar13]) < 0x7f800000) {
                  if (0x7f7fffff < (uint)fVar14) goto LAB_0012f746;
                  fVar18 = pfVar9[lVar13] - pfVar10[lVar13];
                }
                else {
                  fVar18 = 0.0;
                  if ((uint)fVar14 < 0x7f800000) {
LAB_0012f746:
                    fVar18 = INFINITY;
                  }
                }
                lVar12 = lVar12 + (ulong)(fVar17 < fVar18);
                pfVar11[lVar13] = fVar18;
                lVar13 = lVar13 + 1;
              } while (lVar4 != lVar13);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != lVar5);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != iVar1);
    }
  }
  return lVar12;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}